

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O0

void tcu::anon_unknown_3::genScreenSpaceLines
               (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                *screenspaceLines,
               vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
               *lines,IVec2 *viewportSize)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  reference pvVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  Vector<float,_4> local_68;
  undefined1 local_58 [8];
  Vec4 lineScreenSpace [2];
  Vec2 lineNormalizedDeviceSpace [2];
  int lineNdx;
  IVec2 *viewportSize_local;
  vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_> *lines_local
  ;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *screenspaceLines_local;
  
  lineNormalizedDeviceSpace[1].m_data[1] = 0.0;
  while( true ) {
    fVar6 = lineNormalizedDeviceSpace[1].m_data[1];
    sVar3 = std::
            vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
            size(lines);
    if ((int)sVar3 <= (int)fVar6) break;
    pvVar4 = std::
             vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
             operator[](lines,(long)(int)lineNormalizedDeviceSpace[1].m_data[1]);
    fVar6 = Vector<float,_4>::x(pvVar4->positions);
    pvVar4 = std::
             vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
             operator[](lines,(long)(int)lineNormalizedDeviceSpace[1].m_data[1]);
    fVar7 = Vector<float,_4>::w(pvVar4->positions);
    pvVar4 = std::
             vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
             operator[](lines,(long)(int)lineNormalizedDeviceSpace[1].m_data[1]);
    fVar8 = Vector<float,_4>::y(pvVar4->positions);
    pvVar4 = std::
             vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
             operator[](lines,(long)(int)lineNormalizedDeviceSpace[1].m_data[1]);
    fVar9 = Vector<float,_4>::w(pvVar4->positions);
    Vector<float,_2>::Vector
              ((Vector<float,_2> *)(lineScreenSpace[1].m_data + 2),fVar6 / fVar7,fVar8 / fVar9);
    pvVar4 = std::
             vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
             operator[](lines,(long)(int)lineNormalizedDeviceSpace[1].m_data[1]);
    fVar6 = Vector<float,_4>::x(pvVar4->positions + 1);
    pvVar4 = std::
             vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
             operator[](lines,(long)(int)lineNormalizedDeviceSpace[1].m_data[1]);
    fVar7 = Vector<float,_4>::w(pvVar4->positions + 1);
    pvVar4 = std::
             vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
             operator[](lines,(long)(int)lineNormalizedDeviceSpace[1].m_data[1]);
    fVar8 = Vector<float,_4>::y(pvVar4->positions + 1);
    pvVar4 = std::
             vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
             operator[](lines,(long)(int)lineNormalizedDeviceSpace[1].m_data[1]);
    fVar9 = Vector<float,_4>::w(pvVar4->positions + 1);
    Vector<float,_2>::Vector(lineNormalizedDeviceSpace,fVar6 / fVar7,fVar8 / fVar9);
    fVar6 = Vector<float,_2>::x((Vector<float,_2> *)(lineScreenSpace[1].m_data + 2));
    iVar1 = Vector<int,_2>::x(viewportSize);
    fVar7 = Vector<float,_2>::y((Vector<float,_2> *)(lineScreenSpace[1].m_data + 2));
    iVar2 = Vector<int,_2>::y(viewportSize);
    Vector<float,_4>::Vector
              ((Vector<float,_4> *)local_58,(fVar6 + 1.0) * 0.5 * (float)iVar1,
               (fVar7 + 1.0) * 0.5 * (float)iVar2,0.0,1.0);
    fVar6 = Vector<float,_2>::x(lineNormalizedDeviceSpace);
    iVar1 = Vector<int,_2>::x(viewportSize);
    fVar7 = Vector<float,_2>::y(lineNormalizedDeviceSpace);
    iVar2 = Vector<int,_2>::y(viewportSize);
    Vector<float,_4>::Vector
              ((Vector<float,_4> *)(lineScreenSpace[0].m_data + 2),
               (fVar6 + 1.0) * 0.5 * (float)iVar1,(fVar7 + 1.0) * 0.5 * (float)iVar2,0.0,1.0);
    fVar6 = Vector<float,_4>::x((Vector<float,_4> *)local_58);
    fVar7 = Vector<float,_4>::y((Vector<float,_4> *)local_58);
    fVar8 = Vector<float,_4>::x((Vector<float,_4> *)(lineScreenSpace[0].m_data + 2));
    fVar9 = Vector<float,_4>::y((Vector<float,_4> *)(lineScreenSpace[0].m_data + 2));
    Vector<float,_4>::Vector(&local_68,fVar6,fVar7,fVar8,fVar9);
    pvVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       (screenspaceLines,(long)(int)lineNormalizedDeviceSpace[1].m_data[1]);
    *(undefined8 *)pvVar5->m_data = local_68.m_data._0_8_;
    *(undefined8 *)(pvVar5->m_data + 2) = local_68.m_data._8_8_;
    lineNormalizedDeviceSpace[1].m_data[1] =
         (float)((int)lineNormalizedDeviceSpace[1].m_data[1] + 1);
  }
  return;
}

Assistant:

void genScreenSpaceLines (std::vector<tcu::Vec4>& screenspaceLines, const std::vector<LineSceneSpec::SceneLine>& lines, const tcu::IVec2& viewportSize)
{
	DE_ASSERT(screenspaceLines.size() == lines.size());

	for (int lineNdx = 0; lineNdx < (int)lines.size(); ++lineNdx)
	{
		const tcu::Vec2 lineNormalizedDeviceSpace[2] =
		{
			tcu::Vec2(lines[lineNdx].positions[0].x() / lines[lineNdx].positions[0].w(), lines[lineNdx].positions[0].y() / lines[lineNdx].positions[0].w()),
			tcu::Vec2(lines[lineNdx].positions[1].x() / lines[lineNdx].positions[1].w(), lines[lineNdx].positions[1].y() / lines[lineNdx].positions[1].w()),
		};
		const tcu::Vec4 lineScreenSpace[2] =
		{
			tcu::Vec4((lineNormalizedDeviceSpace[0].x() + 1.0f) * 0.5f * (float)viewportSize.x(), (lineNormalizedDeviceSpace[0].y() + 1.0f) * 0.5f * (float)viewportSize.y(), 0.0f, 1.0f),
			tcu::Vec4((lineNormalizedDeviceSpace[1].x() + 1.0f) * 0.5f * (float)viewportSize.x(), (lineNormalizedDeviceSpace[1].y() + 1.0f) * 0.5f * (float)viewportSize.y(), 0.0f, 1.0f),
		};

		screenspaceLines[lineNdx] = tcu::Vec4(lineScreenSpace[0].x(), lineScreenSpace[0].y(), lineScreenSpace[1].x(), lineScreenSpace[1].y());
	}
}